

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decorator_counter_node.hpp
# Opt level: O0

void __thiscall
ranger::bhvr_tree::
decorator_counter_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
::exec(decorator_counter_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
       *this,agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
             *ap,handler_type *hdl)

{
  abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
  *paVar1;
  handler_type *phVar2;
  bool bVar3;
  anon_class_40_2_74ab42ec local_70;
  function<void_(bool,_test_agent_*)> local_48;
  abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
  *local_28;
  abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
  *node;
  handler_type *hdl_local;
  agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
  *ap_local;
  decorator_counter_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
  *this_local;
  
  node = (abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
          *)hdl;
  hdl_local = (handler_type *)ap;
  ap_local = (agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
              *)this;
  local_28 = abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
             ::get_first_child(&this->
                                super_abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                              );
  if ((local_28 ==
       (abstract_node<ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
        *)0x0) ||
     (bVar3 = detail::
              agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
              ::less_then_increase
                        ((agent_proxy_base<ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock,_ranger::bhvr_tree::agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>_>
                          *)hdl_local,this,this->m_count), phVar2 = hdl_local, paVar1 = local_28,
     !bVar3)) {
    agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
    ::operator()((agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
                  *)hdl_local,hdl,false);
  }
  else {
    local_70.ap = (agent_proxy<test_agent,_std::function<void_(bool,_test_agent_*)>,_ranger::bhvr_tree::dummy_mutex,_std::chrono::_V2::system_clock>
                   *)hdl_local;
    std::function<void_(bool,_test_agent_*)>::function(&local_70.hdl,hdl);
    std::function<void(bool,test_agent*)>::
    function<ranger::bhvr_tree::decorator_counter_node<ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>>::exec(ranger::bhvr_tree::agent_proxy<test_agent,std::function<void(bool,test_agent*)>,ranger::bhvr_tree::dummy_mutex,std::chrono::_V2::system_clock>&,std::function<void(bool,test_agent*)>)const::_lambda(bool,test_agent*)_1_,void>
              ((function<void(bool,test_agent*)> *)&local_48,&local_70);
    (*paVar1->_vptr_abstract_node[2])(paVar1,phVar2,&local_48);
    std::function<void_(bool,_test_agent_*)>::~function(&local_48);
    const::{lambda(bool,test_agent*)#1}::~exec((_lambda_bool_test_agent___1_ *)&local_70);
  }
  return;
}

Assistant:

void exec(AgentProxy& ap, typename AgentProxy::handler_type hdl) const final {
    auto node = this->get_first_child();
    if (node && ap.less_then_increase(this, m_count)) {
      node->exec(ap, [=, &ap] (bool result, typename AgentProxy::agent_type*) {
        ap(hdl, result);
      });
    } else {
      ap(hdl, false);
    }
  }